

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_13,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_a8;
  Vector<float,_4> local_98;
  tcu local_80 [8];
  float local_78;
  float local_74;
  VecAccess<float,_4,_3> local_70;
  Matrix<float,_4,_4> local_58;
  
  tcu::Matrix<float,_4,_4>::Matrix(&local_58,(Matrix<float,_4,_4> *)s_constInMat4);
  local_98.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  local_98.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  tcu::operator*(local_80,&local_58,&local_98);
  local_a8.m_data[2] = local_78 + local_74;
  local_a8.m_data._0_8_ = local_80;
  local_70.m_vector = &evalCtx->color;
  local_70.m_index[0] = 0;
  local_70.m_index[1] = 1;
  local_70.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_a8);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}